

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HistogramBasedDistribution.cpp
# Opt level: O1

void __thiscall
HistogramBasedDistribution::printWithGaussian
          (HistogramBasedDistribution *this,ostream *os,double mean,double stddev)

{
  int iVar1;
  ostream *poVar2;
  HistogramBasedDistribution *pHVar3;
  int from;
  pointer ppVar4;
  double dVar5;
  normal norm;
  char local_51;
  double local_50;
  ostream *local_48;
  normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  local_40;
  
  local_48 = os;
  boost::math::
  normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  ::normal_distribution(&local_40,mean,stddev);
  ppVar4 = (this->values).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  from = -1;
  local_50 = -1.0;
  do {
    if (ppVar4 != (this->values).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      iVar1 = ppVar4->first;
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_48,from);
      local_51 = ' ';
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_51,1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,ppVar4->first + -1);
      local_51 = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_51,1);
      pHVar3 = (HistogramBasedDistribution *)
               std::ostream::_M_insert<double>(local_50 * (double)(iVar1 - from));
      local_51 = ' ';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pHVar3,&local_51,1);
      dVar5 = normal_mass(pHVar3,from,ppVar4->first + -1,&local_40);
      poVar2 = std::ostream::_M_insert<double>(dVar5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    from = ppVar4->first;
    local_50 = ppVar4->second;
    ppVar4 = ppVar4 + 1;
  } while (ppVar4 != (this->values).
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  iVar1 = this->max;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_48,from);
  local_51 = ' ';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_51,1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->max);
  local_51 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_51,1);
  pHVar3 = (HistogramBasedDistribution *)
           std::ostream::_M_insert<double>(local_50 * (double)((iVar1 - from) + 1));
  local_51 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pHVar3,&local_51,1);
  dVar5 = normal_mass(pHVar3,from,this->max,&local_40);
  poVar2 = std::ostream::_M_insert<double>(dVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void HistogramBasedDistribution::printWithGaussian(ostream& os, double mean, double stddev) const {
	boost::math::normal norm(mean, stddev);
	vector<HistogramBasedDistribution::value_t>::const_iterator cit = values.begin();
	int start = -1;
	double p = -1.0;
	while (true) {
		if (cit != values.begin()) {
			int length = cit->first - start;
			os << start << ' ' << (cit->first-1) << ' ' << (p*length) << ' ' << normal_mass(start,cit->first-1,norm) << endl;
		}
		start = cit->first;
		p = cit->second;
		++cit;
		if (cit == values.end()) {
			int length = max - start + 1;
			os << start << ' ' << max << ' ' << (p*length) << ' ' << normal_mass(start,max,norm) << endl;
			break;
		}
	}
}